

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_7::ReplaceCubeFaceIndex
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint *puVar1;
  TypeManager *this;
  ConstantManager *this_00;
  IRContext *pIVar2;
  Analysis AVar3;
  uint32_t type;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t operand2;
  array<signed_char,_4UL> aVar6;
  array<signed_char,_4UL> aVar7;
  FeatureManager *pFVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Instruction *this_01;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  InstructionBuilder ir_builder;
  OperandList new_operands;
  undefined1 local_108 [24];
  uint local_f0 [2];
  uint *local_e8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_e0;
  Instruction *local_d8;
  Instruction *local_d0;
  InstructionBuilder local_c8;
  uint32_t local_a4;
  uint32_t local_a0;
  uint32_t local_9c;
  uint32_t local_98;
  uint32_t local_94;
  Instruction *local_90;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_88;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  Instruction *local_48;
  Instruction *local_40;
  IRContext *local_38;
  
  AVar3 = ctx->valid_analyses_;
  if (-1 < (short)AVar3) {
    IRContext::BuildTypeManager(ctx);
    AVar3 = ctx->valid_analyses_;
  }
  this = (ctx->type_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
         .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar3 >> 0xe & 1) == 0) {
    IRContext::BuildConstantManager(ctx);
  }
  this_00 = (ctx->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  type = analysis::TypeManager::GetFloatTypeId(this);
  uVar4 = analysis::TypeManager::GetBoolTypeId(this);
  local_c8.parent_ = IRContext::get_instr_block(ctx,inst);
  local_c8.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  uVar12 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar12 = (uint)inst->has_result_id_;
  }
  local_c8.context_ = ctx;
  local_c8.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
  uVar5 = Instruction::GetSingleWordOperand(inst,uVar12 + 2);
  pFVar8 = (ctx->feature_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
           .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (pFVar8 == (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(ctx);
    pFVar8 = (ctx->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  uVar13 = pFVar8->extinst_importid_GLSLstd450_;
  if (uVar13 == 0) {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"GLSL.std.450","");
    IRContext::AddExtInstImport(ctx,(string *)local_108);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    pFVar8 = (ctx->feature_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
             .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    if (pFVar8 == (FeatureManager *)0x0) {
      IRContext::AnalyzeFeatures(ctx);
      pFVar8 = (ctx->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
    }
    uVar13 = pFVar8->extinst_importid_GLSLstd450_;
  }
  operand2 = analysis::ConstantManager::GetFloatConstId(this_00,0.0);
  local_94 = analysis::ConstantManager::GetFloatConstId(this_00,1.0);
  local_98 = analysis::ConstantManager::GetFloatConstId(this_00,2.0);
  local_9c = analysis::ConstantManager::GetFloatConstId(this_00,3.0);
  local_a0 = analysis::ConstantManager::GetFloatConstId(this_00,4.0);
  local_a4 = analysis::ConstantManager::GetFloatConstId(this_00,5.0);
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_func_int **)0x0;
  local_108._16_8_ = 0;
  local_108._0_8_ = operator_new(4);
  local_108._8_8_ = local_108._0_8_ + 4;
  *(char *)(local_108._0_8_ + 0) = '\0';
  *(char *)(local_108._0_8_ + 1) = '\0';
  *(char *)(local_108._0_8_ + 2) = '\0';
  *(char *)(local_108._0_8_ + 3) = '\0';
  local_108._16_8_ = local_108._8_8_;
  local_d8 = InstructionBuilder::AddCompositeExtract
                       (&local_c8,type,uVar5,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_func_int **)0x0;
  local_108._16_8_ = 0;
  local_38 = ctx;
  local_108._0_8_ = operator_new(4);
  local_108._8_8_ = local_108._0_8_ + 4;
  *(char *)(local_108._0_8_ + 0) = '\x01';
  *(char *)(local_108._0_8_ + 1) = '\0';
  *(char *)(local_108._0_8_ + 2) = '\0';
  *(char *)(local_108._0_8_ + 3) = '\0';
  local_108._16_8_ = local_108._8_8_;
  pIVar9 = InstructionBuilder::AddCompositeExtract
                     (&local_c8,type,uVar5,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_func_int **)0x0;
  local_108._16_8_ = 0;
  local_108._0_8_ = operator_new(4);
  local_108._8_8_ = local_108._0_8_ + 4;
  *(char *)(local_108._0_8_ + 0) = '\x02';
  *(char *)(local_108._0_8_ + 1) = '\0';
  *(char *)(local_108._0_8_ + 2) = '\0';
  *(char *)(local_108._0_8_ + 3) = '\0';
  local_108._16_8_ = local_108._8_8_;
  pIVar10 = InstructionBuilder::AddCompositeExtract
                      (&local_c8,type,uVar5,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  uVar5 = 0;
  if (local_d8->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_d8,(uint)local_d8->has_type_id_);
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_func_int **)0x0;
  local_108._16_8_ = 0;
  local_108._0_8_ = operator_new(4);
  local_108._8_8_ = local_108._0_8_ + 4;
  *(uint32_t *)local_108._0_8_ = uVar5;
  local_108._16_8_ = local_108._8_8_;
  local_90 = InstructionBuilder::AddNaryExtendedInstruction
                       (&local_c8,type,uVar13,4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((uint32_t *)local_108._0_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  uVar5 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_func_int **)0x0;
  local_108._16_8_ = 0;
  local_108._0_8_ = operator_new(4);
  local_108._8_8_ = local_108._0_8_ + 4;
  *(uint32_t *)local_108._0_8_ = uVar5;
  local_d0 = (Instruction *)CONCAT44(local_d0._4_4_,uVar13);
  local_108._16_8_ = local_108._8_8_;
  pIVar11 = InstructionBuilder::AddNaryExtendedInstruction
                      (&local_c8,type,uVar13,4,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((uint32_t *)local_108._0_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  uVar5 = 0;
  if (pIVar10->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_func_int **)0x0;
  local_108._16_8_ = 0;
  local_108._0_8_ = operator_new(4);
  local_108._8_8_ = local_108._0_8_ + 4;
  *(uint32_t *)local_108._0_8_ = uVar5;
  local_108._16_8_ = local_108._8_8_;
  local_48 = InstructionBuilder::AddNaryExtendedInstruction
                       (&local_c8,type,(uint32_t)local_d0,4,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((uint32_t *)local_108._0_8_ != (uint32_t *)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  uVar13 = 0;
  uVar5 = 0;
  if (pIVar10->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  local_40 = InstructionBuilder::AddBinaryOp(&local_c8,uVar4,OpFOrdLessThan,uVar5,operand2);
  if (pIVar9->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pIVar9 = InstructionBuilder::AddBinaryOp(&local_c8,uVar4,OpFOrdLessThan,uVar13,operand2);
  uVar5 = 0;
  if (local_d8->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_d8,(uint)local_d8->has_type_id_);
  }
  local_d8 = InstructionBuilder::AddBinaryOp(&local_c8,uVar4,OpFOrdLessThan,uVar5,operand2);
  if (local_90->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_90,(uint)local_90->has_type_id_);
    uVar14 = (ulong)uVar5;
  }
  else {
    uVar14 = 0;
  }
  if (pIVar11->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
    uVar15 = (ulong)uVar5 << 0x20;
  }
  else {
    uVar15 = 0;
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = (_func_int **)0x0;
  local_108._16_8_ = 0;
  local_108._0_8_ = operator_new(8);
  local_108._8_8_ = local_108._0_8_ + 8;
  *(ulong *)local_108._0_8_ = uVar15 | uVar14;
  local_108._16_8_ = local_108._8_8_;
  pIVar10 = InstructionBuilder::AddNaryExtendedInstruction
                      (&local_c8,type,(uint32_t)local_d0,0x28,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  if ((ulong *)local_108._0_8_ != (ulong *)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  uVar13 = 0;
  uVar5 = 0;
  if (local_48->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(local_48,(uint)local_48->has_type_id_);
  }
  if (pIVar10->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  local_d0 = InstructionBuilder::AddBinaryOp(&local_c8,uVar4,OpFOrdGreaterThanEqual,uVar5,uVar13);
  uVar13 = 0;
  uVar5 = 0;
  if (pIVar11->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  if (local_90->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(local_90,(uint)local_90->has_type_id_);
  }
  pIVar10 = InstructionBuilder::AddBinaryOp(&local_c8,uVar4,OpFOrdGreaterThanEqual,uVar5,uVar13);
  uVar5 = 0;
  uVar4 = 0;
  if (local_40->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(local_40,(uint)local_40->has_type_id_);
  }
  pIVar11 = InstructionBuilder::AddSelect(&local_c8,type,uVar4,local_a4,local_a0);
  if (pIVar9->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pIVar9 = InstructionBuilder::AddSelect(&local_c8,type,uVar5,local_9c,local_98);
  uVar5 = 0;
  uVar4 = 0;
  if (local_d8->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(local_d8,(uint)local_d8->has_type_id_);
  }
  this_01 = InstructionBuilder::AddSelect(&local_c8,type,uVar4,local_94,operand2);
  if (pIVar10->has_result_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
  }
  uVar13 = 0;
  uVar4 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  if (this_01->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
  }
  pIVar9 = InstructionBuilder::AddSelect(&local_c8,type,uVar5,uVar4,uVar13);
  inst->opcode_ = OpSelect;
  local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70[0x10] = '\0';
  local_70[0x11] = '\0';
  local_70[0x12] = '\0';
  local_70[0x13] = '\0';
  if (local_d0->has_result_id_ == true) {
    local_70._16_4_ = Instruction::GetSingleWordOperand(local_d0,(uint)local_d0->has_type_id_);
  }
  puVar1 = (uint *)(local_70 + 0x10);
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70._8_8_ = 1;
  local_108._0_4_ = 1;
  local_108._8_8_ = &PTR__SmallVector_00b02ef8;
  local_108._16_8_ = 0;
  local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_e8 = local_f0;
  local_70._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_70);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_108);
  local_108._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_e0,local_e0._M_head_impl);
  }
  local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50,local_50._M_head_impl);
  }
  aVar6._M_elems[0] = '\0';
  aVar6._M_elems[1] = '\0';
  aVar6._M_elems[2] = '\0';
  aVar6._M_elems[3] = '\0';
  if (pIVar11->has_result_id_ == true) {
    aVar6._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
  }
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70._8_8_ = 1;
  local_108._0_4_ = 1;
  local_108._8_8_ = &PTR__SmallVector_00b02ef8;
  local_108._16_8_ = 0;
  local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_e8 = local_f0;
  local_70._16_4_ = aVar6._M_elems;
  local_70._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_70);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_108);
  local_108._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_e0,local_e0._M_head_impl);
  }
  local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50,local_50._M_head_impl);
  }
  aVar7._M_elems[0] = '\0';
  aVar7._M_elems[1] = '\0';
  aVar7._M_elems[2] = '\0';
  aVar7._M_elems[3] = '\0';
  if (pIVar9->has_result_id_ == true) {
    aVar7._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70._8_8_ = 1;
  local_108._0_4_ = 1;
  local_108._8_8_ = &PTR__SmallVector_00b02ef8;
  local_108._16_8_ = 0;
  local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_e8 = local_f0;
  local_70._16_4_ = aVar7._M_elems;
  local_70._24_8_ = puVar1;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_108 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_70);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&local_88,(Operand *)local_108);
  local_108._8_8_ = &PTR__SmallVector_00b02ef8;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_e0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_e0,local_e0._M_head_impl);
  }
  pIVar2 = local_38;
  local_e0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50,local_50._M_head_impl);
  }
  uVar12 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar12 = (uint)inst->has_result_id_;
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
            (&inst->operands_,
             (Operand *)
             ((long)((((inst->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                    0xfffffffffffffffa) + (ulong)(uVar12 * 0x30)),
             (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
             &inst->operands_,
             (inst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             local_88.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_88.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::UpdateDefUse
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_88);
  return true;
}

Assistant:

bool ReplaceCubeFaceIndex(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  uint32_t float_type_id = type_mgr->GetFloatTypeId();
  uint32_t bool_id = type_mgr->GetBoolTypeId();

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t input_id = inst->GetSingleWordInOperand(2);
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  // Get the constants that will be used.
  uint32_t f0_const_id = const_mgr->GetFloatConstId(0.0);
  uint32_t f1_const_id = const_mgr->GetFloatConstId(1.0);
  uint32_t f2_const_id = const_mgr->GetFloatConstId(2.0);
  uint32_t f3_const_id = const_mgr->GetFloatConstId(3.0);
  uint32_t f4_const_id = const_mgr->GetFloatConstId(4.0);
  uint32_t f5_const_id = const_mgr->GetFloatConstId(5.0);

  // Extract the input values.
  Instruction* x = ir_builder.AddCompositeExtract(float_type_id, input_id, {0});
  Instruction* y = ir_builder.AddCompositeExtract(float_type_id, input_id, {1});
  Instruction* z = ir_builder.AddCompositeExtract(float_type_id, input_id, {2});

  // Get the absolute values of the inputs.
  Instruction* ax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {x->result_id()});
  Instruction* ay = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {y->result_id()});
  Instruction* az = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {z->result_id()});

  // Find which values are negative.  Used in later computations.
  Instruction* is_z_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, z->result_id(), f0_const_id);
  Instruction* is_y_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, y->result_id(), f0_const_id);
  Instruction* is_x_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, x->result_id(), f0_const_id);

  // Find the max value.
  Instruction* amax_x_y = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {ax->result_id(), ay->result_id()});
  Instruction* is_z_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             az->result_id(), amax_x_y->result_id());
  Instruction* y_gr_x =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             ay->result_id(), ax->result_id());

  // Get the value for each case.
  Instruction* case_z = ir_builder.AddSelect(
      float_type_id, is_z_neg->result_id(), f5_const_id, f4_const_id);
  Instruction* case_y = ir_builder.AddSelect(
      float_type_id, is_y_neg->result_id(), f3_const_id, f2_const_id);
  Instruction* case_x = ir_builder.AddSelect(
      float_type_id, is_x_neg->result_id(), f1_const_id, f0_const_id);

  // Select the correct case.
  Instruction* sel =
      ir_builder.AddSelect(float_type_id, y_gr_x->result_id(),
                           case_y->result_id(), case_x->result_id());

  // Get the final result by adding 0.5 to |div|.
  inst->SetOpcode(spv::Op::OpSelect);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {is_z_max->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {case_z->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {sel->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}